

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_26UL> *param_5)

{
  long lVar1;
  undefined8 uVar2;
  long local_58;
  undefined8 uStack_50;
  undefined8 *local_48;
  CappedArray<char,_26UL> local_38;
  
  operator*<int>(&local_58);
  Stringifier::operator*(&local_38,(Stringifier *)&STR,*(long *)(param_2 + 8));
  concat<kj::String,kj::StringPtr&,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_58,(String *)(param_2 + 0x10),(StringPtr *)&local_38
             ,param_5);
  uVar2 = uStack_50;
  lVar1 = local_58;
  if (local_58 != 0) {
    local_58 = 0;
    uStack_50 = 0;
    (**(code **)*local_48)(local_48,lVar1,1,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}